

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

string * EncodeBase64_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  
  sVar3 = input.m_size;
  pbVar7 = input.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar3 + 2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc);
  if (sVar3 == 0) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    pbVar6 = pbVar7 + sVar3;
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar4 = (ulong)(((uint)uVar4 & 0x1f) << 8) | (ulong)*pbVar7;
      uVar5 = uVar5 + 8;
      do {
        uVar5 = uVar5 - 6;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(uVar4 >> ((byte)uVar5 & 0x3f)) & 0x3f]);
      } while (5 < uVar5);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar6);
  }
  if (uVar5 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(uint)(uVar4 << (6U - (char)uVar5 & 0x3f)) & 0x3f]);
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'=');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase64(Span<const unsigned char> input)
{
    static const char *pbase64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    std::string str;
    str.reserve(((input.size() + 2) / 3) * 4);
    ConvertBits<8, 6, true>([&](int v) { str += pbase64[v]; }, input.begin(), input.end());
    while (str.size() % 4) str += '=';
    return str;
}